

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Meter.cc
# Opt level: O0

void __thiscall cppmetrics::Meter::Meter(Meter *this,Clock *clock)

{
  int iVar1;
  undefined4 extraout_var;
  rep __i;
  Clock *local_38;
  Clock *clock_local;
  Meter *this_local;
  
  local_38 = clock;
  if (clock == (Clock *)0x0) {
    local_38 = GetDefaultClock();
  }
  this->m_clock = local_38;
  std::atomic<long>::atomic(&this->m_count,0);
  iVar1 = (**this->m_clock->_vptr_Clock)();
  (this->m_start_time).__r = CONCAT44(extraout_var,iVar1);
  __i = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&this->m_start_time);
  std::atomic<long_long>::atomic(&this->m_last_tick,__i);
  EWMA::one_minute();
  EWMA::five_minutes();
  EWMA::fifteen_minutes();
  return;
}

Assistant:

Meter::Meter(Clock* clock)
    : m_clock(clock != nullptr ? clock : GetDefaultClock())
    , m_count(0)
    , m_start_time(m_clock->tick())
    , m_last_tick(m_start_time.count())
    , m_m1( EWMA::one_minute() )
    , m_m5( EWMA::five_minutes() )
    , m_m15( EWMA::fifteen_minutes() )
{}